

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.cc
# Opt level: O2

void google::protobuf::internal::StringTypeHandlerBase::Delete(string *value)

{
  if (value != (string *)0x0) {
    std::__cxx11::string::~string((string *)value);
  }
  operator_delete(value,0x20);
  return;
}

Assistant:

void StringTypeHandlerBase::Delete(string* value) {
  delete value;
}